

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O0

ENetPacket * enet_packet_create(void *data,size_t dataLength,enet_uint32 flags)

{
  void *pvVar1;
  ENetPacket *packet;
  enet_uint32 flags_local;
  size_t dataLength_local;
  void *data_local;
  
  data_local = enet_malloc(0x30);
  if ((undefined8 *)data_local == (undefined8 *)0x0) {
    data_local = (void *)0x0;
  }
  else {
    if ((flags & 4) == 0) {
      if (dataLength == 0) {
        *(undefined8 *)((long)data_local + 0x10) = 0;
      }
      else {
        pvVar1 = enet_malloc(dataLength);
        *(void **)((long)data_local + 0x10) = pvVar1;
        if (*(long *)((long)data_local + 0x10) == 0) {
          enet_free(data_local);
          return (ENetPacket *)0x0;
        }
        if (data != (void *)0x0) {
          memcpy(*(void **)((long)data_local + 0x10),data,dataLength);
        }
      }
    }
    else {
      *(void **)((long)data_local + 0x10) = data;
    }
    *(undefined8 *)data_local = 0;
    *(enet_uint32 *)((long)data_local + 8) = flags;
    *(size_t *)((long)data_local + 0x18) = dataLength;
    *(undefined8 *)((long)data_local + 0x20) = 0;
    *(undefined8 *)((long)data_local + 0x28) = 0;
  }
  return (ENetPacket *)data_local;
}

Assistant:

ENetPacket *
enet_packet_create (const void * data, size_t dataLength, enet_uint32 flags)
{
    ENetPacket * packet = (ENetPacket *) enet_malloc (sizeof (ENetPacket));
    if (packet == NULL)
      return NULL;

    if (flags & ENET_PACKET_FLAG_NO_ALLOCATE)
      packet -> data = (enet_uint8 *) data;
    else
    if (dataLength <= 0)
      packet -> data = NULL;
    else
    {
       packet -> data = (enet_uint8 *) enet_malloc (dataLength);
       if (packet -> data == NULL)
       {
          enet_free (packet);
          return NULL;
       }

       if (data != NULL)
         memcpy (packet -> data, data, dataLength);
    }

    packet -> referenceCount = 0;
    packet -> flags = flags;
    packet -> dataLength = dataLength;
    packet -> freeCallback = NULL;
    packet -> userData = NULL;

    return packet;
}